

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

base_learner * gd_mf_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  undefined8 uVar3;
  pointer pgVar4;
  unsigned_long uVar5;
  learner<gdmf,_example> *this;
  vw *in_RSI;
  _func_void_gdmf_ptr *in_RDI;
  float fVar6;
  float fVar7;
  learner<gdmf,_example> *l;
  float temp;
  stringstream __msg_3;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  option_group_definition gf_md_options;
  bool conjugate_gradient;
  bool bfgs;
  free_ptr<gdmf> data;
  undefined4 in_stack_fffffffffffff138;
  uint32_t in_stack_fffffffffffff13c;
  typed_option<bool> *in_stack_fffffffffffff140;
  string *in_stack_fffffffffffff148;
  uint32_t in_stack_fffffffffffff150;
  undefined2 in_stack_fffffffffffff154;
  byte in_stack_fffffffffffff156;
  byte in_stack_fffffffffffff157;
  string *in_stack_fffffffffffff158;
  undefined8 in_stack_fffffffffffff160;
  int plineNumber;
  allocator *paVar8;
  undefined6 in_stack_fffffffffffff168;
  undefined1 in_stack_fffffffffffff16e;
  undefined1 in_stack_fffffffffffff16f;
  vw_exception *in_stack_fffffffffffff170;
  _func_void_gdmf_ptr *p_Var9;
  byte local_e7a;
  typed_option<bool> *in_stack_fffffffffffff188;
  option_group_definition *in_stack_fffffffffffff190;
  allocator local_d49;
  string local_d48 [37];
  byte local_d23;
  byte local_d22;
  allocator local_d21;
  string local_d20 [39];
  allocator local_cf9;
  string local_cf8 [39];
  allocator local_cd1;
  string local_cd0 [32];
  float local_cb0;
  undefined1 local_ca9;
  stringstream local_c88 [16];
  ostream local_c78;
  undefined1 local_af9;
  stringstream local_ad8 [16];
  ostream local_ac8;
  allocator local_949;
  string local_948 [39];
  undefined1 local_921;
  stringstream local_900 [16];
  ostream local_8f0;
  allocator local_771;
  string local_770 [39];
  undefined1 local_749;
  stringstream local_728 [16];
  ostream local_718;
  allocator local_599;
  string local_598 [32];
  undefined4 local_578;
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [359];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<unsigned_int> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  vw *local_18;
  _func_void_gdmf_ptr *local_10;
  typed_option<bool> *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff160 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<gdmf>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Gradient Descent Matrix Factorization",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff140,
             (string *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"rank",&local_201);
  std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
            ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x2a3398);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff148,(uint *)in_stack_fffffffffffff140)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"rank for matrix factorization.",&local_229);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff140,
             (string *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff140,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff190,(typed_option<unsigned_int> *)in_stack_fffffffffffff188);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"bfgs",&local_391);
  VW::config::make_option<bool>(in_stack_fffffffffffff148,(bool *)in_stack_fffffffffffff140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"Option not supported by this reduction",&local_3b9);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff140,
             (string *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::typed_option<bool>::typed_option
            (in_stack_fffffffffffff140,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"conjugate_gradient",&local_521);
  VW::config::make_option<bool>(in_stack_fffffffffffff148,(bool *)in_stack_fffffffffffff140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"Option not supported by this reduction",&local_549);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff140,
             (string *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::typed_option<bool>::typed_option
            (in_stack_fffffffffffff140,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff140);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  p_Var9 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"rank",&local_571);
  bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_570);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  p_Var9 = local_10;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_598,"adaptive",&local_599);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_598);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    p_Var9 = local_10;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_728);
      std::operator<<(&local_718,"adaptive is not implemented for matrix factorization");
      local_749 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff170,
                 (char *)CONCAT17(in_stack_fffffffffffff16f,
                                  CONCAT16(in_stack_fffffffffffff16e,in_stack_fffffffffffff168)),
                 plineNumber,in_stack_fffffffffffff158);
      local_749 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_770,"normalized",&local_771);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_770);
    std::__cxx11::string::~string(local_770);
    std::allocator<char>::~allocator((allocator<char> *)&local_771);
    p_Var9 = local_10;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_900);
      std::operator<<(&local_8f0,"normalized is not implemented for matrix factorization");
      local_921 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff170,
                 (char *)CONCAT17(in_stack_fffffffffffff16f,
                                  CONCAT16(in_stack_fffffffffffff16e,in_stack_fffffffffffff168)),
                 plineNumber,in_stack_fffffffffffff158);
      local_921 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_948,"exact_adaptive_norm",&local_949);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_948);
    std::__cxx11::string::~string(local_948);
    std::allocator<char>::~allocator((allocator<char> *)&local_949);
    pvVar1 = local_18;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_ad8);
      std::operator<<(&local_ac8,
                      "normalized adaptive updates is not implemented for matrix factorization");
      local_af9 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff170,
                 (char *)CONCAT17(in_stack_fffffffffffff16f,
                                  CONCAT16(in_stack_fffffffffffff16e,in_stack_fffffffffffff168)),
                 plineNumber,in_stack_fffffffffffff158);
      local_af9 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (((local_29 & 1) != 0) || ((local_2a & 1) != 0)) {
      std::__cxx11::stringstream::stringstream(local_c88);
      std::operator<<(&local_c78,"bfgs is not implemented for matrix factorization");
      local_ca9 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff170,
                 (char *)CONCAT17(in_stack_fffffffffffff16f,
                                  CONCAT16(in_stack_fffffffffffff16e,in_stack_fffffffffffff168)),
                 plineNumber,in_stack_fffffffffffff158);
      local_ca9 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x2a41f0);
    pgVar4->all = pvVar1;
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x2a4208);
    pgVar4->no_win_counter = 0;
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x2a421d);
    fVar6 = logf((float)(pgVar4->rank * 2 + 1));
    fVar7 = logf(2.0);
    local_cb0 = ceilf(fVar6 / fVar7);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c);
    local_18->random_weights = true;
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cd0,"early_terminate",&local_cd1);
      VW::config::options_i::get_typed_option<unsigned_long>
                ((options_i *)in_stack_fffffffffffff170,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff16f,
                          CONCAT16(in_stack_fffffffffffff16e,in_stack_fffffffffffff168)));
      uVar5 = VW::config::typed_option<unsigned_long>::value
                        ((typed_option<unsigned_long> *)in_stack_fffffffffffff140);
      pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                         ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x2a435a);
      pgVar4->early_stop_thres = uVar5;
      std::__cxx11::string::~string(local_cd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
    }
    paVar8 = &local_cf9;
    p_Var9 = local_10;
    std::allocator<char>::allocator();
    local_d22 = 0;
    local_d23 = 0;
    std::__cxx11::string::string(local_cf8,"learning_rate",paVar8);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_cf8);
    local_e7a = 0;
    if ((bVar2 & 1) == 0) {
      p_Var9 = local_10;
      std::allocator<char>::allocator();
      local_d22 = 1;
      std::__cxx11::string::string(local_d20,"l",&local_d21);
      local_d23 = 1;
      local_e7a = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_d20);
      local_e7a = local_e7a ^ 0xff;
    }
    if ((local_d23 & 1) != 0) {
      std::__cxx11::string::~string(local_d20);
    }
    if ((local_d22 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_d21);
    }
    std::__cxx11::string::~string(local_cf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
    if ((local_e7a & 1) != 0) {
      local_18->eta = 10.0;
    }
    paVar8 = &local_d49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d48,"initial_t",paVar8);
    in_stack_fffffffffffff157 = (**(code **)(*(long *)local_10 + 8))(local_10,local_d48);
    in_stack_fffffffffffff156 = in_stack_fffffffffffff157 ^ 0xff;
    std::__cxx11::string::~string(local_d48);
    std::allocator<char>::~allocator((allocator<char> *)&local_d49);
    if ((in_stack_fffffffffffff156 & 1) != 0) {
      local_18->sd->t = 1.0;
      local_18->initial_t = 1.0;
    }
    fVar6 = powf((float)local_18->sd->t,local_18->power_t);
    local_18->eta = local_18->eta * fVar6;
    in_stack_fffffffffffff150 =
         parameters::stride_shift
                   ((parameters *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
    this = LEARNER::init_learner<gdmf,example,LEARNER::learner<char,example>>
                     ((free_ptr<gdmf> *)
                      CONCAT17(in_stack_fffffffffffff157,
                               CONCAT16(in_stack_fffffffffffff156,
                                        CONCAT24(in_stack_fffffffffffff154,in_stack_fffffffffffff150
                                                ))),
                      (_func_void_gdmf_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff148,
                      (_func_void_gdmf_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff140,
                      CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
    LEARNER::learner<gdmf,_example>::set_save_load(this,save_load);
    LEARNER::learner<gdmf,_example>::set_end_pass((learner<gdmf,_example> *)paVar8,local_10);
    LEARNER::learner<gdmf,_example>::set_finish((learner<gdmf,_example> *)paVar8,local_10);
    in_stack_fffffffffffff140 = (typed_option<bool> *)LEARNER::make_base<gdmf,example>(this);
    local_8 = in_stack_fffffffffffff140;
  }
  else {
    local_8 = (typed_option<bool> *)0x0;
  }
  local_578 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff140);
  std::unique_ptr<gdmf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<gdmf,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff157,
                      CONCAT16(in_stack_fffffffffffff156,
                               CONCAT24(in_stack_fffffffffffff154,in_stack_fffffffffffff150))));
  return (base_learner *)local_8;
}

Assistant:

base_learner* gd_mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<gdmf>();

  bool bfgs = false;
  bool conjugate_gradient = false;
  option_group_definition gf_md_options("Gradient Descent Matrix Factorization");
  gf_md_options.add(make_option("rank", data->rank).keep().help("rank for matrix factorization."));

  // Not supported, need to be checked to be false.
  gf_md_options.add(make_option("bfgs", bfgs).help("Option not supported by this reduction"));
  gf_md_options.add(
      make_option("conjugate_gradient", conjugate_gradient).help("Option not supported by this reduction"));
  options.add_and_parse(gf_md_options);

  if (!options.was_supplied("rank"))
    return nullptr;

  if (options.was_supplied("adaptive"))
    THROW("adaptive is not implemented for matrix factorization");
  if (options.was_supplied("normalized"))
    THROW("normalized is not implemented for matrix factorization");
  if (options.was_supplied("exact_adaptive_norm"))
    THROW("normalized adaptive updates is not implemented for matrix factorization");

  if (bfgs || conjugate_gradient)
    THROW("bfgs is not implemented for matrix factorization");

  data->all = &all;
  data->no_win_counter = 0;

  // store linear + 2*rank weights per index, round up to power of two
  float temp = ceilf(logf((float)(data->rank * 2 + 1)) / logf(2.f));
  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    data->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (!options.was_supplied("learning_rate") && !options.was_supplied("l"))
    all.eta = 10;  // default learning rate to 10 for non default update rule

  // default initial_t to 1 instead of 0
  if (!options.was_supplied("initial_t"))
  {
    all.sd->t = 1.f;
    all.initial_t = 1.f;
  }
  all.eta *= powf((float)(all.sd->t), all.power_t);

  learner<gdmf, example>& l = init_learner(data, learn, predict, (UINT64_ONE << all.weights.stride_shift()));
  l.set_save_load(save_load);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}